

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::newBoard(Board *this,Vector2u *size,string *filename,bool startEmpty)

{
  long lVar1;
  Tile ***pppTVar2;
  Tile **ppTVar3;
  Tile *this_00;
  runtime_error *this_01;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  Vector2u local_50 [4];
  
  if ((size->x != 0) && (size->y != 0)) {
    lVar1 = std::__cxx11::string::rfind((char)filename,0x2e);
    if (lVar1 == -1) {
      std::__cxx11::string::_M_assign((string *)&this->name);
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)filename);
      std::__cxx11::string::operator=((string *)&this->name,(string *)local_50);
      std::__cxx11::string::~string((string *)local_50);
    }
    clear(this);
    sf::VertexArray::resize(&this->_vertices,(ulong)(size->x * size->y * 4));
    this->_size = *size;
    _setVertexCoords(this);
    uVar6 = (ulong)size->y;
    pppTVar2 = (Tile ***)operator_new__(uVar6 << 3);
    this->_tileArray = pppTVar2;
    for (uVar5 = 0; uVar5 < uVar6; uVar5 = uVar5 + 1) {
      uVar4 = (ulong)size->x;
      ppTVar3 = (Tile **)operator_new__(uVar4 * 8);
      this->_tileArray[uVar5] = ppTVar3;
      if (!startEmpty) {
        for (uVar6 = 0; uVar6 < uVar4; uVar6 = uVar6 + 1) {
          this_00 = (Tile *)operator_new(0x28);
          local_50[0].x = (uint)uVar6;
          local_50[0].y = (uint)uVar5;
          Tile::Tile(this_00,this,local_50,true,false);
          this->_tileArray[uVar5][uVar6] = this_00;
          uVar4 = (ulong)size->x;
        }
        uVar6 = (ulong)size->y;
      }
    }
    this->changesMade = false;
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_01,"Board dimensions cannot be zero or negative.");
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Board::newBoard(const Vector2u& size, const string& filename, bool startEmpty) {
    if (size.x == 0 || size.y == 0) {
        throw runtime_error("Board dimensions cannot be zero or negative.");
    }
    size_t dotPosition = filename.rfind('.');
    if (dotPosition != string::npos) {
        name = filename.substr(0, dotPosition);
    } else {
        name = filename;
    }
    clear();
    
    _vertices.resize(size.x * size.y * 4);
    _size = size;
    _setVertexCoords();
    _tileArray = new Tile**[size.y];
    for (unsigned int y = 0; y < size.y; ++y) {    // Create new board and add blank tiles if startEmpty is false.
        _tileArray[y] = new Tile*[size.x];
        if (!startEmpty) {
            for (unsigned int x = 0; x < size.x; ++x) {
                _tileArray[y][x] = new Tile(this, Vector2u(x, y), true);
            }
        }
    }
    changesMade = false;
}